

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyfileimpl.cpp
# Opt level: O2

void __thiscall
QNetworkReplyFileImpl::QNetworkReplyFileImpl
          (QNetworkReplyFileImpl *this,QNetworkAccessManager *manager,QNetworkRequest *req,
          Operation op)

{
  long lVar1;
  QAnyStringView newValue;
  QAnyStringView newValue_00;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar2;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar3;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 *paVar4;
  char16_t *pcVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  QNetworkReplyFileImplPrivate *this_00;
  QObject *obj;
  QThread *pQVar9;
  QFile *this_01;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 *paVar10;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_100;
  QFileInfo fi;
  QObject local_f0 [8];
  undefined1 local_e8 [16];
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_d8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 *paStack_d0;
  qsizetype local_c8;
  QHttpHeaders h;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aStack_b0;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 *local_a8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_98;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aStack_90;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 *local_88;
  QUrl url;
  undefined1 local_78 [24];
  undefined8 local_60;
  undefined1 local_58 [8];
  QArrayDataPointer<char16_t> QStack_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QNetworkReplyFileImplPrivate *)operator_new(0x248);
  QNetworkReplyFileImplPrivate::QNetworkReplyFileImplPrivate(this_00);
  QNetworkReply::QNetworkReply
            ((QNetworkReply *)this,(QNetworkReplyPrivate *)this_00,&manager->super_QObject);
  *(undefined ***)this = &PTR_metaObject_002ca638;
  QNetworkReply::setRequest((QNetworkReply *)this,req);
  QNetworkRequest::url((QNetworkRequest *)local_58);
  QNetworkReply::setUrl((QNetworkReply *)this,(QUrl *)local_58);
  QUrl::~QUrl((QUrl *)local_58);
  QNetworkReply::setOperation((QNetworkReply *)this,op);
  QIODevice::open(this,1);
  lVar1 = *(long *)(this + 8);
  *(undefined8 *)(lVar1 + 0x230) = *(undefined8 *)&manager->field_0x8;
  url.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkRequest::url((QNetworkRequest *)&url);
  QUrl::host((QArrayDataPointer<char16_t> *)local_58,(QNetworkRequest *)&url,0x7f00000);
  local_78._0_8_ = (QMetaTypeInterface *)0x9;
  local_78._8_8_ = "localhost";
  bVar6 = ::operator==((QString *)local_58,(QLatin1StringView *)local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
  if (bVar6) {
    local_58 = (undefined1  [8])0x0;
    QStack_50.d = (Data *)0x0;
    QStack_50.ptr = (char16_t *)0x0;
    QUrl::setHost((QString *)&url,(ParsingMode)(QArrayDataPointer<char16_t> *)local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
  }
  QUrl::host((QArrayDataPointer<char16_t> *)local_58,&url,0x7f00000);
  pcVar5 = QStack_50.ptr;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
  if ((anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)pcVar5 !=
      (anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)0x0) {
    paVar10 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)local_58;
    QStack_50.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    QStack_50.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QCoreApplication::translate
              ((char *)local_78,"QNetworkAccessFileBackend","Request for opening non-local file %1",
               0);
    QUrl::toString(&local_98,&url,0);
    QString::arg<QString,_true>
              ((QString *)paVar10,(QString *)local_78,(QString *)&local_98,0,(QChar)0x20);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
    QNetworkReply::setError((QNetworkReply *)this,ProtocolInvalidOperationError,(QString *)paVar10);
    QNetworkReply::setFinished((QNetworkReply *)this,true);
    local_98._0_4_ = 0x12e;
    local_78._0_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<QNetworkReply::NetworkError>::metaType;
    local_78._8_8_ = "QNetworkReply::NetworkError";
    local_78._16_8_ = &local_98;
    QMetaObject::invokeMethod<QMetaMethodArgument>
              ((QObject *)this,"errorOccurred",QueuedConnection,(QMetaMethodArgument *)local_78);
    local_78._0_8_ = fileOpenFinished;
    local_78._8_8_ = (char16_t *)0x0;
    local_98.m_data = local_98.m_data & 0xffffffffffffff00;
    QMetaObject::invokeMethod<void(QNetworkReplyFileImpl::*)(bool),bool>
              ((ContextType *)this,(offset_in_QNetworkReplyFileImpl_to_subr *)local_78,
               QueuedConnection,(bool *)&local_98);
    goto LAB_0018e4ae;
  }
  QUrl::path((QArrayDataPointer<char16_t> *)local_58,&url,0x7f00000);
  pcVar5 = QStack_50.ptr;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
  if ((anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)pcVar5 ==
      (anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)0x0) {
    latin1.m_data = "/";
    latin1.m_size = 1;
    QString::QString((QString *)local_58,latin1);
    QUrl::setPath((QString *)&url,(ParsingMode)(QArrayDataPointer<char16_t> *)local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
  }
  QNetworkReply::setUrl((QNetworkReply *)this,&url);
  local_88 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.m_data = &DAT_aaaaaaaaaaaaaaaa;
  aStack_90.m_data = &DAT_aaaaaaaaaaaaaaaa;
  QUrl::toLocalFile();
  if (local_88 == (anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)0x0) {
    local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QUrl::scheme();
    local_58 = (undefined1  [8])0x3;
    QStack_50.d = (Data *)0x23d5fa;
    bVar6 = ::operator==((QString *)local_78,(QLatin1StringView *)local_58);
    if (bVar6) {
      paVar10 = &local_d8;
      QUrl::path(paVar10,&url,0x7f00000);
      QStack_50.size = local_c8;
      QStack_50.ptr = (char16_t *)paStack_d0;
      QStack_50.d = (Data *)local_d8;
      local_58._0_2_ = 0x3a;
      local_d8.m_data = (undefined1 *)0x0;
      paStack_d0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)0x0;
      local_c8 = 0;
      QStringBuilder<char16_t,_QString>::convertTo<QString>
                ((QString *)&h,(QStringBuilder<char16_t,_QString> *)local_58);
      aVar2 = local_98;
      local_98 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)h.d.d.ptr;
      aStack_90 = aStack_b0;
      h.d.d.ptr = (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)
                  (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)aVar2;
      local_88 = local_a8;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&h);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_50);
    }
    else {
      paVar10 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)local_58;
      QUrl::toString(paVar10,&url,0xde);
      paVar4 = local_88;
      aVar3 = aStack_90;
      aVar2 = local_98;
      local_98 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)local_58;
      aStack_90.m_data = QStack_50.d;
      local_58 = (undefined1  [8])aVar2;
      QStack_50.d = (Data *)aVar3;
      local_88 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)QStack_50.ptr;
      QStack_50.ptr = (char16_t *)paVar4;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)paVar10);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
  }
  local_78._0_8_ = (InterfaceType *)0x0;
  local_78._8_8_ = (char16_t *)0x0;
  local_78._16_8_ = (anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)0x0;
  local_60 = 2;
  QNetworkRequest::attribute
            ((QVariant *)local_58,req,BackgroundRequestAttribute,(QVariant *)local_78);
  cVar7 = QVariant::toBool();
  QVariant::~QVariant((QVariant *)local_58);
  QVariant::~QVariant((QVariant *)local_78);
  if (cVar7 == '\0') {
    QNetworkReply::setFinished((QNetworkReply *)this,true);
    _fi = &DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo(&fi,(QString *)&local_98);
    cVar7 = QFileInfo::isDir();
    if (cVar7 == '\0') {
      this_01 = (QFile *)operator_new(0x10);
      QFile::QFile(this_01,(QString *)&local_98,(QObject *)this);
      QWeakPointer<QObject>::assign<QObject>
                ((QWeakPointer<QObject> *)(lVar1 + 0x238),(QObject *)this_01);
      cVar7 = (**(code **)(**(long **)(lVar1 + 0x240) + 0x68))(*(long **)(lVar1 + 0x240),0x21);
      if (cVar7 == '\0') {
        QStack_50.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
        QStack_50.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        QCoreApplication::translate
                  ((char *)local_78,"QNetworkAccessFileBackend","Error opening %1: %2",0);
        (**(code **)(**(long **)(lVar1 + 0x240) + 0xe8))
                  ((anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)&h);
        QIODevice::errorString();
        QString::arg<QString,QString>
                  ((type *)local_58,(QString *)local_78,(QString *)&h,(QString *)&local_d8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_d8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&h);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
        cVar7 = QFileInfo::exists();
        if (cVar7 == '\0') {
          QNetworkReply::setError((QNetworkReply *)this,ContentNotFoundError,(QString *)local_58);
          h.d.d.ptr._0_4_ = 0xcb;
        }
        else {
          QNetworkReply::setError((QNetworkReply *)this,ContentAccessDenied,(QString *)local_58);
          h.d.d.ptr._0_4_ = 0xc9;
        }
        local_78._0_8_ =
             &QtPrivate::QMetaTypeInterfaceWrapper<QNetworkReply::NetworkError>::metaType;
        local_78._8_8_ = "QNetworkReply::NetworkError";
        local_78._16_8_ = (anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)&h;
        QMetaObject::invokeMethod<QMetaMethodArgument>
                  ((QObject *)this,"errorOccurred",QueuedConnection,(QMetaMethodArgument *)local_78)
        ;
        QMetaObject::invokeMethod<>((QObject *)this,"finished",QueuedConnection);
        goto LAB_0018e49a;
      }
      h.d.d.ptr = (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QNetworkReply::headers((QNetworkReply *)&h);
      QFileInfo::lastModified((QFileInfo *)local_78);
      QNetworkHeadersPrivate::toHttpDate((QByteArray *)local_58,(QDateTime *)local_78);
      newValue.m_size = (size_t)QStack_50.ptr;
      newValue.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)QStack_50.d;
      QHttpHeaders::replaceOrAppend(&h,LastModified,newValue);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_58);
      QDateTime::~QDateTime((QDateTime *)local_78);
      iVar8 = QFileInfo::size();
      QByteArray::number((longlong)local_58,iVar8);
      newValue_00.m_size = (size_t)QStack_50.ptr;
      newValue_00.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)QStack_50.d;
      QHttpHeaders::replaceOrAppend(&h,ContentLength,newValue_00);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_58);
      QNetworkReply::setHeaders((QNetworkReply *)this,&h);
      QMetaObject::invokeMethod<>((QObject *)this,"metaDataChanged",QueuedConnection);
      local_d8.m_data = (void *)QFileInfo::size();
      QStack_50.ptr = (char16_t *)&local_d8;
      local_58 = (undefined1  [8])&QtPrivate::QMetaTypeInterfaceWrapper<long_long>::metaType;
      QStack_50.d = (Data *)0x240543;
      local_100.m_data = (void *)QFileInfo::size();
      local_78._16_8_ = &local_100;
      local_78._0_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<long_long>::metaType;
      local_78._8_8_ = "qint64";
      QMetaObject::invokeMethod<QMetaMethodArgument,QMetaMethodArgument>
                ((QObject *)this,"downloadProgress",QueuedConnection,(QMetaMethodArgument *)local_58
                 ,(QMetaMethodArgument *)local_78);
      QMetaObject::invokeMethod<>((QObject *)this,"readyRead",QueuedConnection);
      QMetaObject::invokeMethod<>((QObject *)this,"finished",QueuedConnection);
      QHttpHeaders::~QHttpHeaders(&h);
    }
    else {
      QStack_50.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      QStack_50.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QCoreApplication::translate
                ((char *)local_78,"QNetworkAccessFileBackend","Cannot open %1: Path is a directory",
                 0);
      QUrl::toString((anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)&h,&url,0);
      QString::arg<QString,_true>
                ((QString *)local_58,(QString *)local_78,(QString *)&h,0,(QChar)0x20);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&h);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
      QNetworkReply::setError
                ((QNetworkReply *)this,ContentOperationNotPermittedError,(QString *)local_58);
      h.d.d.ptr._0_4_ = 0xca;
      local_78._0_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<QNetworkReply::NetworkError>::metaType;
      local_78._8_8_ = "QNetworkReply::NetworkError";
      local_78._16_8_ = (anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)&h;
      QMetaObject::invokeMethod<QMetaMethodArgument>
                ((QObject *)this,"errorOccurred",QueuedConnection,(QMetaMethodArgument *)local_78);
      QMetaObject::invokeMethod<>((QObject *)this,"finished",QueuedConnection);
LAB_0018e49a:
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
    }
    QFileInfo::~QFileInfo(&fi);
  }
  else {
    obj = (QObject *)operator_new(0x10);
    QNetworkFile::QNetworkFile((QNetworkFile *)obj,(QString *)&local_98);
    local_58 = (undefined1  [8])QNetworkReply::setWellKnownHeader;
    QStack_50.d = (Data *)0x0;
    QObject::
    connect<void(QNetworkFile::*)(QHttpHeaders::WellKnownHeader,QByteArray_const&),void(QNetworkReply::*)(QHttpHeaders::WellKnownHeader,QByteArrayView)>
              ((Object *)(local_e8 + 8),(offset_in_QNetworkFile_to_subr)obj,
               (ContextType *)QNetworkFile::headerRead,(offset_in_QNetworkReply_to_subr *)0x0,
               (ConnectionType)this);
    QMetaObject::Connection::~Connection((Connection *)(local_e8 + 8));
    local_58 = (undefined1  [8])QNetworkReply::setError;
    QStack_50.d = (Data *)0x0;
    QObject::
    connect<void(QNetworkFile::*)(QNetworkReply::NetworkError,QString_const&),void(QNetworkReply::*)(QNetworkReply::NetworkError,QString_const&)>
              ((Object *)local_e8,(offset_in_QNetworkFile_to_subr)obj,
               (ContextType *)QNetworkFile::networkError,(offset_in_QNetworkReply_to_subr *)0x0,
               (ConnectionType)this);
    QMetaObject::Connection::~Connection((Connection *)local_e8);
    QObject::connect(local_f0,(char *)obj,(QObject *)"2finished(bool)",(char *)this,0x24065c);
    QMetaObject::Connection::~Connection((Connection *)local_f0);
    pQVar9 = QNetworkAccessManagerPrivate::createThread
                       (*(QNetworkAccessManagerPrivate **)(lVar1 + 0x230));
    QObject::moveToThread(obj,pQVar9);
    QMetaObject::invokeMethod<>(obj,"open",QueuedConnection);
    QWeakPointer<QObject>::assign<QObject>((QWeakPointer<QObject> *)(lVar1 + 0x238),obj);
  }
  paVar10 = &local_98;
LAB_0018e4ae:
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)paVar10);
  QUrl::~QUrl(&url);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkReplyFileImpl::QNetworkReplyFileImpl(QNetworkAccessManager *manager, const QNetworkRequest &req, const QNetworkAccessManager::Operation op)
    : QNetworkReply(*new QNetworkReplyFileImplPrivate(), manager)
{
    setRequest(req);
    setUrl(req.url());
    setOperation(op);
    QNetworkReply::open(QIODevice::ReadOnly);

    QNetworkReplyFileImplPrivate *d = (QNetworkReplyFileImplPrivate*) d_func();

    d->managerPrivate = manager->d_func();

    QUrl url = req.url();
    if (url.host() == "localhost"_L1)
        url.setHost(QString());

#if !defined(Q_OS_WIN)
    // do not allow UNC paths on Unix
    if (!url.host().isEmpty()) {
        // we handle only local files
        QString msg = QCoreApplication::translate("QNetworkAccessFileBackend", "Request for opening non-local file %1").arg(url.toString());
        setError(QNetworkReply::ProtocolInvalidOperationError, msg);
        setFinished(true); // We're finished, will emit finished() after ctor is done.
        QMetaObject::invokeMethod(this, "errorOccurred", Qt::QueuedConnection,
            Q_ARG(QNetworkReply::NetworkError, QNetworkReply::ProtocolInvalidOperationError));
        QMetaObject::invokeMethod(this, &QNetworkReplyFileImpl::fileOpenFinished, Qt::QueuedConnection, false);
        return;
    }
#endif
    if (url.path().isEmpty())
        url.setPath("/"_L1);
    setUrl(url);

    QString fileName = url.toLocalFile();
    if (fileName.isEmpty()) {
        const QString scheme = url.scheme();
        if (scheme == "qrc"_L1) {
            fileName = u':' + url.path();
        } else {
#if defined(Q_OS_ANDROID)
            if (scheme == "assets"_L1)
                fileName = "assets:"_L1 + url.path();
            else
#endif
                fileName = url.toString(QUrl::RemoveAuthority | QUrl::RemoveFragment | QUrl::RemoveQuery);
        }
    }

    if (req.attribute(QNetworkRequest::BackgroundRequestAttribute).toBool()) { // Asynchronous open
        auto realFile = new QNetworkFile(fileName);
        connect(realFile, &QNetworkFile::headerRead, this, &QNetworkReplyFileImpl::setWellKnownHeader,
                Qt::QueuedConnection);
        connect(realFile, &QNetworkFile::networkError, this, &QNetworkReplyFileImpl::setError,
                Qt::QueuedConnection);
        connect(realFile, SIGNAL(finished(bool)), SLOT(fileOpenFinished(bool)),
                Qt::QueuedConnection);

        realFile->moveToThread(d->managerPrivate->createThread());
        QMetaObject::invokeMethod(realFile, "open", Qt::QueuedConnection);

        d->realFile = realFile;
    } else { // Synch open
        setFinished(true);

        QFileInfo fi(fileName);
        if (fi.isDir()) {
            QString msg = QCoreApplication::translate("QNetworkAccessFileBackend", "Cannot open %1: Path is a directory").arg(url.toString());
            setError(QNetworkReply::ContentOperationNotPermittedError, msg);
            QMetaObject::invokeMethod(this, "errorOccurred", Qt::QueuedConnection,
                Q_ARG(QNetworkReply::NetworkError, QNetworkReply::ContentOperationNotPermittedError));
            QMetaObject::invokeMethod(this, "finished", Qt::QueuedConnection);
            return;
        }
        d->realFile = new QFile(fileName, this);
        bool opened = d->realFile->open(QIODevice::ReadOnly | QIODevice::Unbuffered);

        // could we open the file?
        if (!opened) {
            QString msg = QCoreApplication::translate("QNetworkAccessFileBackend", "Error opening %1: %2")
                    .arg(d->realFile->fileName(), d->realFile->errorString());

            if (fi.exists()) {
                setError(QNetworkReply::ContentAccessDenied, msg);
                QMetaObject::invokeMethod(this, "errorOccurred", Qt::QueuedConnection,
                    Q_ARG(QNetworkReply::NetworkError, QNetworkReply::ContentAccessDenied));
            } else {
                setError(QNetworkReply::ContentNotFoundError, msg);
                QMetaObject::invokeMethod(this, "errorOccurred", Qt::QueuedConnection,
                    Q_ARG(QNetworkReply::NetworkError, QNetworkReply::ContentNotFoundError));
            }
            QMetaObject::invokeMethod(this, "finished", Qt::QueuedConnection);
            return;
        }
        auto h = headers();
        h.replaceOrAppend(QHttpHeaders::WellKnownHeader::LastModified,
                          QNetworkHeadersPrivate::toHttpDate(fi.lastModified()));
        h.replaceOrAppend(QHttpHeaders::WellKnownHeader::ContentLength,
                          QByteArray::number(fi.size()));
        setHeaders(std::move(h));

        QMetaObject::invokeMethod(this, "metaDataChanged", Qt::QueuedConnection);
        QMetaObject::invokeMethod(this, "downloadProgress", Qt::QueuedConnection,
            Q_ARG(qint64, fi.size()), Q_ARG(qint64, fi.size()));
        QMetaObject::invokeMethod(this, "readyRead", Qt::QueuedConnection);
        QMetaObject::invokeMethod(this, "finished", Qt::QueuedConnection);
    }
}